

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QByteArray,QRhiGles2::PipelineCacheData>::emplace<QRhiGles2::PipelineCacheData_const&>
          (QHash<QByteArray,QRhiGles2::PipelineCacheData> *this,QByteArray *key,
          PipelineCacheData *args)

{
  Data *pDVar1;
  Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  PipelineCacheData local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
LAB_00584d3c:
    pDVar2 = *(Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> **)this;
    local_40._0_8_ = pDVar1;
    if ((pDVar2 == (Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_>::
               detached(pDVar2);
      *(Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> **)this = pDVar2;
    }
    pVar3 = (piter)emplace_helper<QRhiGles2::PipelineCacheData_const&>(this,key,args);
    QHash<QByteArray,_QRhiGles2::PipelineCacheData>::~QHash
              ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)&local_40);
  }
  else {
    if (1 < *(uint *)&pDVar1->ref) {
      if ((pDVar1 != (Data *)0x0) && (*(uint *)&pDVar1->ref != 0xffffffff)) {
        LOCK();
        pDVar1->ref = (RefCount)(*(uint *)&pDVar1->ref + 1);
        UNLOCK();
      }
      goto LAB_00584d3c;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QRhiGles2::PipelineCacheData_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_00584dfb;
    }
    local_40.format = args->format;
    local_40.data.d.d = (args->data).d.d;
    local_40.data.d.ptr = (args->data).d.ptr;
    local_40.data.d.size = (args->data).d.size;
    if (&(local_40.data.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_40.data.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_40.data.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar3 = (piter)QHash<QByteArray,_QRhiGles2::PipelineCacheData>::
                   emplace_helper<QRhiGles2::PipelineCacheData>
                             ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)this,key,&local_40)
    ;
    if (&(local_40.data.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_40.data.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_00584dfb:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }